

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

void destroy_stream(quicly_stream_t *stream,int err)

{
  anon_struct_32_2_6d702f80_for_pending_link *paVar1;
  quicly_linklist_t *pqVar2;
  uint8_t *puVar3;
  khint_t kVar4;
  quicly_conn_t *conn;
  _func_void_void_ptr_char_ptr_varargs *p_Var5;
  kh_quicly_stream_t_t *pkVar6;
  khint64_t kVar7;
  st_quicly_linklist_t *psVar8;
  st_quicly_linklist_t *psVar9;
  ulong uVar10;
  long lVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  
  conn = stream->conn;
  p_Var5 = (conn->super).tracer.cb;
  if (p_Var5 != (_func_void_void_ptr_char_ptr_varargs *)0x0) {
    (*p_Var5)((conn->super).tracer.ctx,
              "{\"type\":\"stream-on-destroy\", \"time\":%lld, \"stream-id\":%d, \"err\":%lld}\n",
              (conn->stash).now,(ulong)(uint)stream->stream_id,(long)err);
  }
  if (stream->callbacks != (quicly_stream_callbacks_t *)0x0) {
    (*stream->callbacks->on_destroy)(stream,err);
  }
  pkVar6 = conn->streams;
  kVar7 = stream->stream_id;
  kVar4 = pkVar6->n_buckets;
  uVar14 = (uint)kVar7;
  if (kVar4 == 0) {
    uVar13 = 0;
LAB_0011fe85:
    if (uVar13 != kVar4) {
      uVar15 = pkVar6->flags[uVar13 >> 4];
      uVar17 = uVar13 * 2 & 0x1e;
      if ((uVar15 >> (sbyte)uVar17 & 3) == 0) {
        pkVar6->flags[uVar13 >> 4] = uVar15 | 1 << uVar17;
        pkVar6->size = pkVar6->size - 1;
      }
      if ((long)kVar7 < 0) {
        puVar3 = &(stream->conn->egress).pending_flows;
        *puVar3 = *puVar3 & ~(byte)(1 << (~(byte)kVar7 & 0x1f));
      }
      else {
        uVar10 = (ulong)((uVar14 & 2) << 3);
        lVar11 = uVar10 + 0x270;
        if ((((uint)(conn->super).local.bidi.next_stream_id ^ uVar14) & 1) == 0) {
          lVar11 = uVar10 + 0x148;
        }
        puVar3 = (conn->super).local.cid_set.cids[0].cid.cid + lVar11 + -0x30;
        *(int *)puVar3 = *(int *)puVar3 + -1;
      }
      quicly_sendstate_dispose(&stream->sendstate);
      quicly_recvstate_dispose(&stream->recvstate);
      paVar1 = &(stream->_send_aux).pending_link;
      psVar8 = (stream->_send_aux).pending_link.control.prev;
      psVar9 = (stream->_send_aux).pending_link.control.next;
      psVar8->next = psVar9;
      psVar9->prev = psVar8;
      (stream->_send_aux).pending_link.control.next = &paVar1->control;
      (stream->_send_aux).pending_link.control.prev = &paVar1->control;
      pqVar2 = &(stream->_send_aux).pending_link.default_scheduler;
      psVar8 = (stream->_send_aux).pending_link.default_scheduler.prev;
      psVar9 = (stream->_send_aux).pending_link.default_scheduler.next;
      psVar8->next = psVar9;
      psVar9->prev = psVar8;
      (stream->_send_aux).pending_link.default_scheduler.next = pqVar2;
      (stream->_send_aux).pending_link.default_scheduler.prev = pqVar2;
      if (conn->application != (st_quicly_application_space_t *)0x0) {
        uVar14 = 0;
        if (-1 < stream->stream_id) {
          uVar14 = (uint)((ulong)stream->stream_id >> 1) & 1;
        }
        iVar16 = should_send_max_streams(conn,uVar14);
        if (iVar16 != 0) {
          (conn->egress).send_ack_at = 0;
        }
      }
      free(stream);
      return;
    }
  }
  else {
    uVar15 = ((uint)(kVar7 >> 0x21) ^ uVar14 << 0xb ^ uVar14) & kVar4 - 1;
    iVar16 = 1;
    uVar13 = uVar15;
    do {
      bVar12 = (char)uVar13 * '\x02' & 0x1e;
      uVar17 = pkVar6->flags[uVar13 >> 4] >> bVar12;
      if (((uVar17 & 2) != 0) || (((uVar17 & 1) == 0 && (pkVar6->keys[uVar13] == kVar7)))) {
        if ((pkVar6->flags[uVar13 >> 4] >> bVar12 & 3) != 0) {
          uVar13 = kVar4;
        }
        goto LAB_0011fe85;
      }
      uVar13 = uVar13 + iVar16 & kVar4 - 1;
      iVar16 = iVar16 + 1;
    } while (uVar13 != uVar15);
  }
  __assert_fail("iter != kh_end(conn->streams)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                ,0x462,"void destroy_stream(quicly_stream_t *, int)");
}

Assistant:

static void destroy_stream(quicly_stream_t *stream, int err)
{
    quicly_conn_t *conn = stream->conn;

    QUICLY_PROBE(STREAM_ON_DESTROY, conn, conn->stash.now, stream, err);

    if (stream->callbacks != NULL)
        stream->callbacks->on_destroy(stream, err);

    khiter_t iter = kh_get(quicly_stream_t, conn->streams, stream->stream_id);
    assert(iter != kh_end(conn->streams));
    kh_del(quicly_stream_t, conn->streams, iter);

    if (stream->stream_id < 0) {
        size_t epoch = -(1 + stream->stream_id);
        stream->conn->egress.pending_flows &= ~(uint8_t)(1 << epoch);
    } else {
        struct st_quicly_conn_streamgroup_state_t *group = get_streamgroup_state(conn, stream->stream_id);
        --group->num_streams;
    }

    dispose_stream_properties(stream);

    if (conn->application != NULL) {
        /* The function is normally invoked when receiving a packet, therefore just setting send_ack_at to zero is sufficient to
         * trigger the emission of the MAX_STREAMS frame. FWIW, the only case the function is invoked when not receiving a packet is
         * when the connection is being closed. In such case, the change will not have any bad side effects.
         */
        if (should_send_max_streams(conn, quicly_stream_is_unidirectional(stream->stream_id)))
            conn->egress.send_ack_at = 0;
    }

    free(stream);
}